

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  long lVar1;
  bool bVar2;
  depth_target____fx_depthtarget_common__AttributeData *pdVar3;
  StringHash SVar4;
  uint64 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool bVar8;
  bool failed_1;
  bool failed_2;
  bool local_3a;
  bool failed;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  pdVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::depth_target____fx_depthtarget_common__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar7 = attributes->attributes;
  if (ppxVar7 == (xmlChar **)0x0) {
    bVar8 = true;
  }
  else {
LAB_006e0aac:
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            text = *ppxVar7;
            bVar8 = text == (ParserChar *)0x0;
            if (bVar8) {
              return bVar8;
            }
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
            buffer = ppxVar7[1];
            ppxVar7 = ppxVar7 + 2;
            if (SVar4 != 0x7400) break;
            uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,&failed_2);
            pdVar3->mip = uVar5;
            if (failed_2 == true) {
              SVar4 = 0x7400;
              goto LAB_006e0bdd;
            }
          }
          if (SVar4 != 0x6c795) break;
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash(buffer,&local_3a);
          lVar1 = 0;
          do {
            lVar6 = lVar1;
            if (lVar6 + 0x10 == 0x70) {
              local_3a = true;
              pdVar3->face = ENUM__fx_surface_face_enum__COUNT;
              SVar4 = 0x6c795;
              goto LAB_006e0bdd;
            }
            lVar1 = lVar6 + 0x10;
          } while (*(StringHash *)((long)&ENUM__fx_surface_face_enumMap + lVar6) != SVar4);
          pdVar3->face = *(ENUM__fx_surface_face_enum *)((long)&DAT_0086c318 + lVar6);
        }
        if (SVar4 != 0x7a2f95) break;
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,&failed_1);
        pdVar3->slice = uVar5;
        if (failed_1 == true) {
          SVar4 = 0x7a2f95;
LAB_006e0bdd:
          bVar8 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                             0x4f724,SVar4,buffer);
          if (bVar8) {
            return false;
          }
        }
      }
      if (SVar4 == 0x704ac8) {
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,&failed);
        pdVar3->index = uVar5;
        if (failed == true) {
          SVar4 = 0x704ac8;
          goto LAB_006e0bdd;
        }
        goto LAB_006e0aac;
      }
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x4f724,text,
                         buffer);
    } while (!bVar2);
  }
  return bVar8;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__depth_target____fx_depthtarget_common( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

depth_target____fx_depthtarget_common__AttributeData* attributeData = newData<depth_target____fx_depthtarget_common__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_face:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__fx_surface_face_enum, StringHash, ENUM__fx_surface_face_enum__COUNT>(attributeValue, failed, ENUM__fx_surface_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_face,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_mip:
    {
bool failed;
attributeData->mip = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_mip,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_slice:
    {
bool failed;
attributeData->slice = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_slice,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DEPTH_TARGET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}